

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

bool __thiscall LowererMD::GenerateFastAdd(LowererMD *this,Instr *instrAdd)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  LabelInstr *labelFail;
  Opnd *pOVar6;
  Instr *pIVar7;
  AddrOpnd *pAVar8;
  IntConstOpnd *src2Opnd;
  BranchInstr *pBVar9;
  LabelInstr *branchTarget;
  Opnd *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  pOVar6 = instrAdd->m_src1;
  this_00 = instrAdd->m_src2;
  if (pOVar6 == (Opnd *)0x0 || this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xbea,"(opndSrc1 && opndSrc2)","Expected 2 src opnd\'s on Add instruction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
  if (bVar2) {
    pRVar5 = IR::Opnd::AsRegOpnd(pOVar6);
    bVar2 = IR::Opnd::IsNotInt(&pRVar5->super_Opnd);
    if (bVar2) {
      return false;
    }
    local_36 = (pOVar6->m_valueType).field_0;
    bVar2 = ValueType::IsString((ValueType *)&local_36.field_0);
    if (bVar2) {
      return false;
    }
    if (instrAdd->m_opcode != Incr_A) {
      local_34 = (pOVar6->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyString((ValueType *)&local_34.field_0);
      if (bVar2) {
        return false;
      }
    }
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    pRVar5 = IR::Opnd::AsRegOpnd(this_00);
    bVar2 = IR::Opnd::IsNotInt(&pRVar5->super_Opnd);
    if (bVar2) {
      return false;
    }
    local_32 = (this_00->m_valueType).field_0;
    bVar2 = ValueType::IsLikelyString((ValueType *)&local_32.field_0);
    if (bVar2) {
      return false;
    }
  }
  bVar2 = IR::Opnd::IsTaggedInt(pOVar6);
  if (bVar2) {
    bVar2 = IR::Opnd::IsTaggedInt(this_00);
  }
  else {
    bVar2 = false;
  }
  labelFail = IR::LabelInstr::New(Label,this->m_func,true);
  if (bVar2 == false) {
    GenerateSmIntPairTest(this,instrAdd,pOVar6,this_00,labelFail);
  }
  bVar2 = IR::Opnd::IsAddrOpnd(pOVar6);
  this_01 = this_00;
  if (bVar2) {
    this_01 = pOVar6;
    pOVar6 = this_00;
  }
  pOVar6 = IR::Opnd::UseWithNewType(pOVar6,TyInt32,this->m_func);
  pRVar5 = IR::RegOpnd::New(TyInt32,this->m_func);
  pIVar7 = IR::Instr::New(MOV,&pRVar5->super_Opnd,pOVar6,this->m_func);
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  bVar2 = IR::Opnd::IsAddrOpnd(this_01);
  if (bVar2) {
    pAVar8 = IR::Opnd::AsAddrOpnd(this_01);
    iVar3 = (int)pAVar8->m_address;
    if (iVar3 == 1) {
      pIVar7 = IR::Instr::New(INC,&pRVar5->super_Opnd,&pRVar5->super_Opnd,this->m_func);
      goto LAB_005d880a;
    }
    src2Opnd = IR::IntConstOpnd::New((long)iVar3,TyInt32,this->m_func,false);
  }
  else {
    src2Opnd = (IntConstOpnd *)IR::Opnd::UseWithNewType(this_01,TyInt32,this->m_func);
  }
  pIVar7 = IR::Instr::New(ADD,&pRVar5->super_Opnd,&pRVar5->super_Opnd,&src2Opnd->super_Opnd,
                          this->m_func);
LAB_005d880a:
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  Legalize<false>(pIVar7,false);
  pBVar9 = IR::BranchInstr::New(JO,labelFail,this->m_func);
  IR::Instr::InsertBefore(instrAdd,&pBVar9->super_Instr);
  if ((pRVar5->super_Opnd).m_type != TyInt64) {
    pRVar5 = (RegOpnd *)IR::Opnd::UseWithNewType(&pRVar5->super_Opnd,TyUint64,this->m_func);
  }
  GenerateInt32ToVarConversion(this,&pRVar5->super_Opnd,instrAdd);
  pIVar7 = IR::Instr::New(MOV,instrAdd->m_dst,&pRVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  pBVar9 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrAdd,&pBVar9->super_Instr);
  IR::Instr::InsertBefore(instrAdd,&labelFail->super_Instr);
  IR::Instr::InsertAfter(instrAdd,&branchTarget->super_Instr);
  return true;
}

Assistant:

bool
LowererMD::GenerateFastAdd(IR::Instr * instrAdd)
{
    // Given:
    //
    // dst = Add src1, src2
    //
    // Generate:
    //
    // (If not 2 Int31's, jump to $helper.)
    // s1 = MOV src1
    // s1 = DEC s1          -- Get rid of one of the tag [Int31 only]
    // s1 = ADD s1, src2    -- try an inline add
    //      JO $helper      -- bail if the add overflowed
    // s1 = OR s1, AtomTag_IntPtr                        [Int32 only]
    // dst = MOV s1
    //      JMP $fallthru
    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    IR::Instr *      instr;
    IR::LabelInstr * labelHelper;
    IR::LabelInstr * labelFallThru;
    IR::Opnd *       opndReg;
    IR::Opnd *       opndSrc1;
    IR::Opnd *       opndSrc2;

    opndSrc1 = instrAdd->GetSrc1();
    opndSrc2 = instrAdd->GetSrc2();
    AssertMsg(opndSrc1 && opndSrc2, "Expected 2 src opnd's on Add instruction");

    // Generate fastpath for Incr_A anyway -
    // Incrementing strings representing integers can be inter-mixed with integers e.g. "1"++ -> converts 1 to an int and thereafter, integer increment is expected.
    if (opndSrc1->IsRegOpnd() && (opndSrc1->AsRegOpnd()->IsNotInt() || opndSrc1->GetValueType().IsString()
        || (instrAdd->m_opcode != Js::OpCode::Incr_A && opndSrc1->GetValueType().IsLikelyString())))
    {
        return false;
    }

    if (opndSrc2->IsRegOpnd() && (opndSrc2->AsRegOpnd()->IsNotInt() ||
        opndSrc2->GetValueType().IsLikelyString()))
    {
        return false;
    }

    // Tagged ints?
    bool isTaggedInts = false;
    if (opndSrc1->IsTaggedInt())
    {
        if (opndSrc2->IsTaggedInt())
        {
            isTaggedInts = true;
        }
    }

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!isTaggedInts)
    {
        // (If not 2 Int31's, jump to $helper.)

        this->GenerateSmIntPairTest(instrAdd, opndSrc1, opndSrc2, labelHelper);
    }

    if (opndSrc1->IsAddrOpnd())
    {
        // If opnd1 is a constant, just swap them.
        IR::Opnd *opndTmp = opndSrc1;
        opndSrc1 = opndSrc2;
        opndSrc2 = opndTmp;
    }

    //
    // For 32 bit arithmetic we copy them and set the size of operands to be 32 bits. This is
    // relevant only on AMD64.
    //

    opndSrc1    = opndSrc1->UseWithNewType(TyInt32, this->m_func);

    // s1 = MOV src1

    opndReg = IR::RegOpnd::New(TyInt32, this->m_func);
    instr = IR::Instr::New(Js::OpCode::MOV, opndReg, opndSrc1, this->m_func);
    instrAdd->InsertBefore(instr);

#if !INT32VAR
    // Do the DEC in place
    if (opndSrc2->IsAddrOpnd())
    {
        Assert(opndSrc2->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindConstantVar);
        opndSrc2 = IR::IntConstOpnd::New(*((int *)&(opndSrc2->AsAddrOpnd()->m_address)) - 1, TyInt32, this->m_func, opndSrc2->AsAddrOpnd()->m_dontEncode);
        opndSrc2 = opndSrc2->Use(this->m_func);
    }
    else if (opndSrc2->IsIntConstOpnd())
    {
        Assert(opndSrc2->GetType() == TyInt32);
        opndSrc2 = opndSrc2->Use(this->m_func);
        opndSrc2->AsIntConstOpnd()->DecrValue(1);
    }
    else
    {
        // s1 = DEC s1
        opndSrc2 = opndSrc2->UseWithNewType(TyInt32, this->m_func);
        instr = IR::Instr::New(Js::OpCode::DEC, opndReg, opndReg, this->m_func);
        instrAdd->InsertBefore(instr);
    }

    instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
#else
    if (opndSrc2->IsAddrOpnd())
    {
        // truncate to untag
        int value = ::Math::PointerCastToIntegralTruncate<int>(opndSrc2->AsAddrOpnd()->m_address);
        if (value == 1)
        {
            instr = IR::Instr::New(Js::OpCode::INC, opndReg, opndReg, this->m_func);
        }
        else
        {
            opndSrc2 = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
            instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
        }
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2->UseWithNewType(TyInt32, this->m_func), this->m_func);
    }
#endif

    // s1 = ADD s1, src2
    instrAdd->InsertBefore(instr);
    Legalize(instr);

    //      JO $helper

    instr = IR::BranchInstr::New(Js::OpCode::JO, labelHelper, this->m_func);
    instrAdd->InsertBefore(instr);

    //
    // Convert TyInt32 operand, back to TyMachPtr type.
    //

    if(TyMachReg != opndReg->GetType())
    {
        opndReg = opndReg->UseWithNewType(TyMachPtr, this->m_func);
    }

#if INT32VAR
    // s1 = OR s1, AtomTag_IntPtr
    GenerateInt32ToVarConversion(opndReg, instrAdd);
#endif

    // dst = MOV s1

    instr = IR::Instr::New(Js::OpCode::MOV, instrAdd->GetDst(), opndReg, this->m_func);
    instrAdd->InsertBefore(instr);

    //      JMP $fallthru

    labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(Js::OpCode::JMP, labelFallThru, this->m_func);
    instrAdd->InsertBefore(instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    instrAdd->InsertBefore(labelHelper);
    instrAdd->InsertAfter(labelFallThru);

    return true;
}